

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Cylinder::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Cylinder *this,Point2f *u)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  Transform *pTVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Point3fi pi;
  Tuple3<pbrt::Point3,_float> local_78;
  Point3fi local_68;
  Tuple3<pbrt::Vector3,_float> local_50;
  Point3fi local_40;
  
  fVar11 = (u->super_Tuple2<pbrt::Point2,_float>).x;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(fVar11 * this->zMax)),ZEXT416((uint)(1.0 - fVar11)),
                           ZEXT416((uint)this->zMin));
  fVar7 = (u->super_Tuple2<pbrt::Point2,_float>).y * this->phiMax;
  fVar11 = this->radius;
  fVar10 = cosf(fVar7);
  fVar10 = fVar10 * fVar11;
  fVar11 = this->radius;
  local_78.y = sinf(fVar7);
  local_78.y = local_78.y * fVar11;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(local_78.y * local_78.y)),ZEXT416((uint)fVar10),
                           ZEXT416((uint)fVar10));
  local_78.z = auVar9._0_4_;
  local_78.x = fVar10;
  if (auVar8._0_4_ < 0.0) {
    fVar11 = sqrtf(auVar8._0_4_);
  }
  else {
    auVar9 = vsqrtss_avx(auVar8,auVar8);
    fVar11 = auVar9._0_4_;
  }
  fVar11 = this->radius / fVar11;
  auVar12._0_4_ = local_78.x * fVar11;
  auVar12._4_4_ = local_78.y * fVar11;
  auVar12._8_4_ = fVar11 * 0.0;
  auVar12._12_4_ = fVar11 * 0.0;
  local_78._0_8_ = vmovlps_avx(auVar12);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar9 = vandps_avx512vl(auVar12,auVar9);
  auVar8._8_4_ = 0x34400002;
  auVar8._0_8_ = 0x3440000234400002;
  auVar8._12_4_ = 0x34400002;
  auVar9 = vmulps_avx512vl(auVar9,auVar8);
  local_50._0_8_ = vmovlps_avx(auVar9);
  local_50.z = 0.0;
  pTVar6 = this->renderFromObject;
  Point3fi::Point3fi(&local_40,(Point3f *)&local_78,(Vector3f *)&local_50);
  Transform::operator()(&local_68,pTVar6,&local_40);
  pTVar6 = this->renderFromObject;
  auVar15._4_4_ = local_78.x;
  auVar15._0_4_ = local_78.x;
  auVar15._8_4_ = local_78.x;
  auVar15._12_4_ = local_78.x;
  auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_78.y * (pTVar6->mInv).m[1][2])),auVar15,
                           ZEXT416((uint)(pTVar6->mInv).m[0][2]));
  auVar9 = vfmadd231ss_fma(auVar9,ZEXT816(0) << 0x40,ZEXT416((uint)(pTVar6->mInv).m[2][2]));
  fVar7 = auVar9._0_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(pTVar6->mInv).m[0];
  uVar4 = *(undefined8 *)(pTVar6->mInv).m[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(pTVar6->mInv).m[2];
  auVar13._0_4_ = local_78.y * (float)uVar4;
  auVar13._4_4_ = local_78.y * (float)((ulong)uVar4 >> 0x20);
  auVar13._8_4_ = local_78.y * 0.0;
  auVar13._12_4_ = local_78.y * 0.0;
  auVar9 = vfmadd231ps_fma(auVar13,auVar15,auVar18);
  auVar8 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar20,auVar9);
  auVar14._0_4_ = auVar8._0_4_ * auVar8._0_4_;
  auVar14._4_4_ = auVar8._4_4_ * auVar8._4_4_;
  auVar14._8_4_ = auVar8._8_4_ * auVar8._8_4_;
  auVar14._12_4_ = auVar8._12_4_ * auVar8._12_4_;
  auVar9 = vhaddps_avx(auVar14,auVar14);
  fVar11 = auVar9._0_4_ + fVar7 * fVar7;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    auVar9 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    fVar11 = auVar9._0_4_;
  }
  auVar16._4_4_ = fVar11;
  auVar16._0_4_ = fVar11;
  auVar16._8_4_ = fVar11;
  auVar16._12_4_ = fVar11;
  auVar9 = vdivps_avx(auVar8,auVar16);
  bVar5 = this->reverseOrientation;
  auVar17 = auVar9;
  if (bVar5 != false) {
    auVar17._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
    auVar17._8_4_ = auVar9._8_4_ ^ 0x80000000;
    auVar17._12_4_ = auVar9._12_4_ ^ 0x80000000;
  }
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
  (__return_storage_ptr__->optionalValue).__align =
       (anon_struct_8_0_00000001_for___align)
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
  *(Interval<float> *)((long)&__return_storage_ptr__->optionalValue + 8) =
       local_68.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
  fVar10 = this->zMax;
  fVar1 = this->zMin;
  fVar2 = this->radius;
  fVar3 = this->phiMax;
  __return_storage_ptr__->set = true;
  auVar19._0_12_ = ZEXT812(0);
  auVar19._12_4_ = 0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x18) = auVar19;
  uVar4 = vmovlps_avx(auVar17);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = uVar4;
  *(uint *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
       (uint)(bVar5 & 1) * (int)-(fVar7 / fVar11) + (uint)!(bool)(bVar5 & 1) * (int)(fVar7 / fVar11)
  ;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x34) = auVar19;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x40) = auVar19;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
       1.0 / ((fVar10 - fVar1) * fVar2 * fVar3);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const Point2f &u) const {
        Float z = Lerp(u[0], zMin, zMax);
        Float phi = u[1] * phiMax;
        // Compute cylinder sample position _pi_ and normal _n_ from $z$ and $\phi$
        Point3f pObj = Point3f(radius * std::cos(phi), radius * std::sin(phi), z);
        // Reproject _pObj_ to cylinder surface and compute _pObjError_
        Float hitRad = std::sqrt(pObj.x * pObj.x + pObj.y * pObj.y);
        pObj.x *= radius / hitRad;
        pObj.y *= radius / hitRad;
        Vector3f pObjError = gamma(3) * Abs(Vector3f(pObj.x, pObj.y, 0));

        Point3fi pi = (*renderFromObject)(Point3fi(pObj, pObjError));
        Normal3f n = Normalize((*renderFromObject)(Normal3f(pObj.x, pObj.y, 0)));
        if (reverseOrientation)
            n *= -1;

        return ShapeSample{Interaction(pi, n), 1 / Area()};
    }